

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O1

void __thiscall
divsufsortxx::core::constructSA_from_typeBstar<char*,bitmap::BitmapArray<long>::iterator,long,int>
          (core *this,char *T,iterator SA,long *bucket_A,long *bucket_B,long n,long m,
          int alphabetsize)

{
  core cVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  pos_type pVar6;
  BitmapArray<long> *pBVar7;
  undefined1 *puVar8;
  BitmapArray<long> *pBVar9;
  undefined1 *puVar10;
  undefined1 *puVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  bool bVar15;
  BitmapArray<long> *local_80;
  
  pVar6 = SA.pos_;
  pBVar7 = SA.array_;
  if (1 < (int)m && 0 < n) {
    lVar14 = (long)((int)m + -2);
    local_80 = pBVar7;
    do {
      lVar2 = lVar14 * (m & 0xffffffffU);
      puVar11 = (undefined1 *)
                ((long)&(pBVar7->super_Bitmap)._vptr_Bitmap + bucket_A[lVar2 + lVar14 + 1]);
      lVar4 = *(long *)(pVar6 + 8 + lVar14 * 8);
      if (puVar11 < (undefined1 *)((long)&(pBVar7->super_Bitmap)._vptr_Bitmap + lVar4 + 1)) {
        uVar12 = 0xffffffff;
        puVar8 = (undefined1 *)((long)&(pBVar7->super_Bitmap)._vptr_Bitmap + lVar4);
        do {
          uVar3 = (**(code **)(*(long *)T + 0x28))(T,puVar8);
          if ((long)uVar3 < 0) {
            uVar5 = ~uVar3;
            lVar4 = *(long *)T;
            puVar10 = puVar8;
LAB_0010576e:
            (**(code **)(lVar4 + 0x20))(T,puVar10,uVar5);
LAB_00105771:
            uVar13 = (ulong)uVar12;
          }
          else {
            if (uVar3 == 0) goto LAB_00105771;
            cVar1 = this[uVar3 - 1];
            uVar13 = (ulong)(char)cVar1;
            if (lVar14 < (long)uVar13) goto LAB_00105771;
            (**(code **)(*(long *)T + 0x20))(T,puVar8,~uVar3);
            if ((long)uVar3 < 2) {
              uVar5 = 0;
            }
            else {
              uVar5 = uVar3 - 1;
              if ((char)cVar1 < (char)this[uVar3 - 2]) {
                uVar5 = -uVar3;
              }
            }
            if (uVar12 == (int)(char)cVar1) {
              local_80 = (BitmapArray<long> *)&local_80[-1].field_0x27;
              lVar4 = *(long *)T;
              puVar10 = (undefined1 *)local_80;
              goto LAB_0010576e;
            }
            if (-1 < (int)uVar12) {
              bucket_A[lVar2 + (ulong)uVar12] = (long)local_80 - (long)pBVar7;
            }
            local_80 = (BitmapArray<long> *)((long)pBVar7 + bucket_A[lVar2 + (int)(char)cVar1] + -1)
            ;
            (**(code **)(*(long *)T + 0x20))(T,local_80,uVar5);
          }
          uVar12 = (uint)uVar13;
          bVar15 = puVar11 < puVar8;
          puVar8 = puVar8 + -1;
        } while (bVar15);
      }
      bVar15 = 0 < lVar14;
      lVar14 = lVar14 + -1;
    } while (bVar15);
  }
  uVar3 = (ulong)(char)(this + -1)[(long)bucket_B];
  lVar14 = (long)&(pBVar7->super_Bitmap)._vptr_Bitmap + *(long *)(pVar6 + uVar3 * 8) + 1;
  (**(code **)(*(long *)T + 0x20))(T,lVar14,(long)bucket_B + -1);
  pBVar9 = pBVar7;
  if (pBVar7 < (BitmapArray<long> *)((long)&(pBVar7->super_Bitmap)._vptr_Bitmap + (long)bucket_B)) {
    do {
      uVar5 = (**(code **)(*(long *)T + 0x28))(T,pBVar9);
      if ((long)uVar5 < 0) {
        (**(code **)(*(long *)T + 0x20))(T,pBVar9,~uVar5);
      }
      else if (uVar5 != 0) {
        cVar1 = this[uVar5 - 1];
        uVar12 = (uint)(char)cVar1;
        if ((char)this[uVar5] <= (char)cVar1) {
          if ((long)uVar5 < 2) {
            lVar4 = 0;
          }
          else {
            lVar4 = uVar5 - 1;
            if ((char)this[uVar5 - 2] < (char)cVar1) {
              lVar4 = -uVar5;
            }
          }
          if ((uint)uVar3 == uVar12) {
            lVar14 = lVar14 + 1;
            (**(code **)(*(long *)T + 0x20))(T,lVar14);
          }
          else {
            *(long *)(pVar6 + (long)(int)(uint)uVar3 * 8) = lVar14 - (long)pBVar7;
            lVar14 = (long)&(pBVar7->super_Bitmap)._vptr_Bitmap +
                     *(long *)(pVar6 + (long)(int)uVar12 * 8) + 1;
            (**(code **)(*(long *)T + 0x20))(T,lVar14,lVar4);
            uVar3 = (ulong)uVar12;
          }
        }
      }
      bucket_B = (long *)((long)bucket_B + -1);
      pBVar9 = (BitmapArray<long> *)((long)&(pBVar9->super_Bitmap)._vptr_Bitmap + 1);
    } while (bucket_B != (long *)0x0);
  }
  return;
}

Assistant:

void constructSA_from_typeBstar(const StringIterator_type T, SAIterator_type SA,
                                pos_type *bucket_A, pos_type *bucket_B,
                                pos_type n, pos_type m,
                                alphabetsize_type alphabetsize) {
  SAIterator_type i, j, t = SA;
  pos_type s;
  alphabetsize_type c0, c1, c2;

  /** An implementation version of MSufSort3's second stage. **/

  if (0 < m) {
    /* Construct the sorted order of type B suffixes by using
     the sorted order of type B* suffixes. */
    for (c1 = alphabetsize - 2; 0 <= c1; --c1) {
      /* Scan the suffix array from right to left. */
      for (i = SA + BUCKET_BSTAR(c1, c1 + 1), j = SA + (BUCKET_A(c1 + 1)+ 1),
      c2 = -1;
      i < j;) {
        if(0 <= (s = *--j)) {
          if((0 <= --s) && ((c0 = T[s]) <= c1)) {
            *j = ~(s + 1);
            if((0 < s) && (T[s - 1] > c0)) {s = ~s;}
            if(c2 == c0) {*--t = s;}
            else {
              if(0 <= c2) {BUCKET_B(c2, c1) = t - SA;}
              *(t = SA + BUCKET_B(c2 = c0, c1) - 1) = s;
            }
          }
        } else {
          *j = ~s;
        }
      }
    }
  }

  /* Construct the suffix array by using
   the sorted order of type B suffixes. */
  *(t = SA + (BUCKET_A(c2 = T[n - 1])+ 1)) = n - 1;
  /* Scan the suffix array from left to right. */
  for (i = SA, j = SA + n; i < j; ++i) {
    if (0 <= (s = *i)) {
      if ((0 <= --s) && ((c0 = T[s]) >= T[s + 1])) {
        if ((0 < s) && (T[s - 1] < c0)) {
          s = ~s;
        }
        if (c0 == c2) {
          *++t = s;
        } else {
          BUCKET_A(c2)= t - SA;
          *(t = SA + (BUCKET_A(c2 = c0) + 1)) = s;
        }
      }
    } else {
      *i = ~s;
    }
  }
}